

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStencilbufferTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FboStencilTests::init(FboStencilTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  ChannelOrder CVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  BasicFboStencilCase *pBVar4;
  char *pcVar5;
  DepthStencilAttachCase *pDVar6;
  TestCaseGroup *attachGroup;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Vector<int,_2> local_3c;
  TextureFormat local_34;
  TextureFormat texFmt;
  deUint32 format;
  int fmtNdx;
  TestCaseGroup *basicGroup;
  FboStencilTests *this_local;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic stencil tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (texFmt.type = SNORM_INT8; (int)texFmt.type < 3; texFmt.type = texFmt.type + SNORM_INT16) {
    texFmt.order = init::stencilFormats[(int)texFmt.type];
    local_34 = glu::mapGLInternalFormat(texFmt.order);
    pBVar4 = (BasicFboStencilCase *)operator_new(0x98);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar5 = FboTestUtil::getFormatName(texFmt.order);
    CVar2 = texFmt.order;
    tcu::Vector<int,_2>::Vector(&local_3c,0x6f,0x84);
    BasicFboStencilCase::BasicFboStencilCase(pBVar4,pCVar1,pcVar5,"",CVar2,&local_3c,false);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
    if (local_34.order == DS) {
      pBVar4 = (BasicFboStencilCase *)operator_new(0x98);
      attachGroup._3_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar5 = FboTestUtil::getFormatName(texFmt.order);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar5,&local_81);
      std::operator+(&local_60,&local_80,"_depth");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      CVar2 = texFmt.order;
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)((long)&attachGroup + 4),0x6f,0x84);
      BasicFboStencilCase::BasicFboStencilCase
                (pBVar4,pCVar1,pcVar5,"",CVar2,(IVec2 *)((long)&attachGroup + 4),true);
      attachGroup._3_1_ = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
    }
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"attach",
             "Attaching depth stencil");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pDVar6 = (DepthStencilAttachCase *)operator_new(0x90);
  DepthStencilAttachCase::DepthStencilAttachCase
            (pDVar6,(this->super_TestCaseGroup).m_context,"depth_only",
             "Only depth part of depth-stencil RBO attached",0x8d00,0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pDVar6);
  pDVar6 = (DepthStencilAttachCase *)operator_new(0x90);
  DepthStencilAttachCase::DepthStencilAttachCase
            (pDVar6,(this->super_TestCaseGroup).m_context,"stencil_only",
             "Only stencil part of depth-stencil RBO attached",0,0x8d20);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pDVar6);
  pDVar6 = (DepthStencilAttachCase *)operator_new(0x90);
  DepthStencilAttachCase::DepthStencilAttachCase
            (pDVar6,(this->super_TestCaseGroup).m_context,"depth_stencil_separate",
             "Depth and stencil attached separately",0x8d00,0x8d20);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pDVar6);
  pDVar6 = (DepthStencilAttachCase *)operator_new(0x90);
  DepthStencilAttachCase::DepthStencilAttachCase
            (pDVar6,(this->super_TestCaseGroup).m_context,"depth_stencil_attachment",
             "Depth and stencil attached with DEPTH_STENCIL_ATTACHMENT",0x821a,0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pDVar6);
  return extraout_EAX;
}

Assistant:

void FboStencilTests::init (void)
{
	static const deUint32 stencilFormats[] =
	{
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic stencil tests");
		addChild(basicGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(stencilFormats); fmtNdx++)
		{
			deUint32			format		= stencilFormats[fmtNdx];
			tcu::TextureFormat	texFmt		= glu::mapGLInternalFormat(format);

			basicGroup->addChild(new BasicFboStencilCase(m_context, getFormatName(format), "", format, IVec2(111, 132), false));

			if (texFmt.order == tcu::TextureFormat::DS)
				basicGroup->addChild(new BasicFboStencilCase(m_context, (string(getFormatName(format)) + "_depth").c_str(), "", format, IVec2(111, 132), true));
		}
	}

	// .attach
	{
		tcu::TestCaseGroup* attachGroup = new tcu::TestCaseGroup(m_testCtx, "attach", "Attaching depth stencil");
		addChild(attachGroup);

		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_only",				"Only depth part of depth-stencil RBO attached",			GL_DEPTH_ATTACHMENT,			GL_NONE));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "stencil_only",				"Only stencil part of depth-stencil RBO attached",			GL_NONE,						GL_STENCIL_ATTACHMENT));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_stencil_separate",	"Depth and stencil attached separately",					GL_DEPTH_ATTACHMENT,			GL_STENCIL_ATTACHMENT));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_stencil_attachment",	"Depth and stencil attached with DEPTH_STENCIL_ATTACHMENT",	GL_DEPTH_STENCIL_ATTACHMENT,	GL_NONE));
	}
}